

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O0

uint16_t rcg::anon_unknown_2::getUint16(uint8_t *p,bool bigendian,size_t i)

{
  size_t j_1;
  size_t j;
  uint16_t ret;
  size_t i_local;
  bool bigendian_local;
  uint8_t *p_local;
  
  if (bigendian) {
    ret = CONCAT11(p[i * 2],p[i * 2 + 1]);
  }
  else {
    ret = CONCAT11(p[i * 2 + 1],p[i * 2]);
  }
  return ret;
}

Assistant:

inline uint16_t getUint16(const uint8_t *p, bool bigendian, size_t i)
{
  uint16_t ret;

  if (bigendian)
  {
    size_t j=i<<1;
    ret=static_cast<uint16_t>(((p[j]<<8)|p[j+1]));
  }
  else
  {
    size_t j=i<<1;
    ret=static_cast<uint16_t>(((p[j+1]<<8)|p[j]));
  }

  return ret;
}